

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O2

void PPC_post_printer(csh ud,cs_insn *insn,char *insn_asm,MCInst *mci)

{
  int iVar1;
  char *pcVar2;
  
  if (*(int *)(ud + 0x60) != 3) {
    return;
  }
  pcVar2 = strrchr(insn_asm,0x2b);
  if ((pcVar2 == (char *)0x0) || (pcVar2 = strstr(insn_asm,".+"), pcVar2 != (char *)0x0)) {
    pcVar2 = strrchr(insn_asm,0x2d);
    if (pcVar2 == (char *)0x0) {
      return;
    }
    iVar1 = 2;
  }
  else {
    iVar1 = 1;
  }
  (insn->detail->field_6).arm.vector_size = iVar1;
  return;
}

Assistant:

void PPC_post_printer(csh ud, cs_insn *insn, char *insn_asm, MCInst *mci)
{
	if (((cs_struct *)ud)->detail != CS_OPT_ON)
		return;

	// check if this insn has branch hint
	if (strrchr(insn_asm, '+') != NULL && !strstr(insn_asm, ".+")) {
		insn->detail->ppc.bh = PPC_BH_PLUS;
	} else if (strrchr(insn_asm, '-') != NULL) {
		insn->detail->ppc.bh = PPC_BH_MINUS;
	}
}